

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetKey(GLFWwindow *handle,int key)

{
  uint in_ESI;
  long in_RDI;
  _GLFWwindow *window;
  int local_4;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = 0;
  }
  else if (((int)in_ESI < 0x20) || (0x15c < (int)in_ESI)) {
    _glfwInputError(0x10003,"Invalid key %i",(ulong)in_ESI);
    local_4 = 0;
  }
  else if (*(char *)(in_RDI + 0x88 + (long)(int)in_ESI) == '\x03') {
    *(undefined1 *)(in_RDI + 0x88 + (long)(int)in_ESI) = 0;
    local_4 = 1;
  }
  else {
    local_4 = (int)*(char *)(in_RDI + 0x88 + (long)(int)in_ESI);
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwGetKey(GLFWwindow* handle, int key)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (key < GLFW_KEY_SPACE || key > GLFW_KEY_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid key %i", key);
        return GLFW_RELEASE;
    }

    if (window->keys[key] == _GLFW_STICK)
    {
        // Sticky mode: release key now
        window->keys[key] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->keys[key];
}